

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcChain.c
# Opt level: O3

int Bmc_ChainTest(Gia_Man_t *p,int nFrameMax,int nConfMax,int fVerbose,int fVeryVerbose,
                 Vec_Ptr_t **pvCexes)

{
  Vec_Ptr_t **ppVVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  Gia_Man_t *pGVar6;
  Vec_Ptr_t *pVVar7;
  void **ppvVar8;
  Abc_Cex_t *p_00;
  Gia_Man_t *p_01;
  Vec_Int_t *pVVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  double dVar15;
  timespec ts;
  timespec local_a8;
  int local_98;
  uint local_94;
  long local_90;
  ulong local_88;
  Vec_Ptr_t **local_80;
  uint local_78;
  uint local_74;
  Vec_Int_t *local_70;
  long local_68;
  long local_60;
  long local_58;
  int local_4c;
  long local_48;
  Gia_Man_t *local_40;
  long local_38;
  
  pVVar9 = (Vec_Int_t *)(ulong)(uint)fVerbose;
  local_98 = fVerbose;
  local_80 = pvCexes;
  local_78 = nFrameMax;
  local_74 = nConfMax;
  local_4c = fVeryVerbose;
  pGVar6 = Gia_ManDup(p);
  iVar2 = clock_gettime(3,&local_a8);
  if (iVar2 < 0) {
    local_90 = -1;
  }
  else {
    pVVar9 = (Vec_Int_t *)-(local_a8.tv_nsec >> 0x3f);
    local_90 = local_a8.tv_nsec / 1000 + local_a8.tv_sec * 1000000;
  }
  if (local_80 != (Vec_Ptr_t **)0x0) {
    pVVar7 = (Vec_Ptr_t *)malloc(0x10);
    pVVar7->nCap = 1000;
    pVVar7->nSize = 0;
    ppvVar8 = (void **)malloc(8000);
    pVVar7->pArray = ppvVar8;
    *local_80 = pVVar7;
  }
  local_88 = 0;
  local_94 = 0;
  lVar13 = 0;
  local_60 = 0;
  local_58 = 0;
  lVar11 = 0;
  while( true ) {
    if (pGVar6->vCos->nSize == pGVar6->nRegs) {
      local_68 = lVar11;
      if (local_98 != 0) {
        puts("Finished all POs.");
      }
      goto LAB_0058a249;
    }
    iVar2 = clock_gettime(3,&local_a8);
    if (iVar2 < 0) {
      lVar10 = 1;
    }
    else {
      lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_a8.tv_nsec),8);
      pVVar9 = (Vec_Int_t *)-(lVar10 >> 0x3f);
      lVar10 = (long)&pVVar9[local_a8.tv_sec * -0xf424].nCap + (lVar10 >> 7);
    }
    p_00 = Bmc_ChainFailOneOutput(pGVar6,local_78,local_74,(int)pVVar9,local_4c);
    iVar2 = clock_gettime(3,&local_a8);
    if (iVar2 < 0) {
      local_68 = -1;
    }
    else {
      local_68 = local_a8.tv_nsec / 1000 + local_a8.tv_sec * 1000000;
    }
    local_68 = lVar11 + lVar10 + local_68;
    if (p_00 == (Abc_Cex_t *)0x0) break;
    if (((int)local_88 != 0) && (p_00->iFrame < 1)) {
      __assert_fail("!Iter || pCex->iFrame > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcChain.c"
                    ,0x14c,"int Bmc_ChainTest(Gia_Man_t *, int, int, int, int, Vec_Ptr_t **)");
    }
    iVar2 = clock_gettime(3,&local_a8);
    if (iVar2 < 0) {
      lVar11 = 1;
    }
    else {
      lVar11 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_a8.tv_nsec),8);
      lVar11 = ((lVar11 >> 7) - (lVar11 >> 0x3f)) + local_a8.tv_sec * -1000000;
    }
    p_01 = Gia_ManVerifyCexAndMove(pGVar6,p_00);
    Gia_ManStop(pGVar6);
    local_94 = local_94 + p_00->iFrame;
    iVar2 = clock_gettime(3,&local_a8);
    if (iVar2 < 0) {
      lVar10 = -1;
    }
    else {
      lVar10 = local_a8.tv_nsec / 1000 + local_a8.tv_sec * 1000000;
    }
    iVar2 = clock_gettime(3,&local_a8);
    if (iVar2 < 0) {
      local_48 = 1;
    }
    else {
      lVar12 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_a8.tv_nsec),8);
      local_48 = ((lVar12 >> 7) - (lVar12 >> 0x3f)) + local_a8.tv_sec * -1000000;
    }
    if (local_80 == (Vec_Ptr_t **)0x0) {
      pVVar7 = (Vec_Ptr_t *)0x0;
    }
    else {
      pVVar7 = *local_80;
    }
    local_38 = lVar13;
    local_70 = Bmc_ChainFindFailedOutputs(p_01,pVVar7);
    uVar4 = local_70->nSize;
    if ((long)(int)uVar4 < 1) {
LAB_0058a5b5:
      __assert_fail("Vec_IntFind(vOutputs, pCex->iPo) >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcChain.c"
                    ,0x156,"int Bmc_ChainTest(Gia_Man_t *, int, int, int, int, Vec_Ptr_t **)");
    }
    local_58 = local_58 + lVar11 + lVar10;
    pVVar9 = (Vec_Int_t *)local_70->pArray;
    lVar11 = 0;
    while ((&pVVar9->nCap)[lVar11] != p_00->iPo) {
      lVar11 = lVar11 + 1;
      if ((int)uVar4 == lVar11) goto LAB_0058a5b5;
    }
    if (local_80 == (Vec_Ptr_t **)0x0) {
      Abc_CexFree(p_00);
    }
    else {
      pVVar7 = *local_80;
      uVar3 = pVVar7->nSize;
      if (uVar3 == pVVar7->nCap) {
        if ((int)uVar3 < 0x10) {
          if (pVVar7->pArray == (void **)0x0) {
            ppvVar8 = (void **)malloc(0x80);
          }
          else {
            ppvVar8 = (void **)realloc(pVVar7->pArray,0x80);
          }
          pVVar7->pArray = ppvVar8;
          pVVar7->nCap = 0x10;
        }
        else {
          if (pVVar7->pArray == (void **)0x0) {
            ppvVar8 = (void **)malloc((ulong)uVar3 << 4);
          }
          else {
            ppvVar8 = (void **)realloc(pVVar7->pArray,(ulong)uVar3 << 4);
          }
          pVVar7->pArray = ppvVar8;
          pVVar7->nCap = uVar3 * 2;
        }
      }
      else {
        ppvVar8 = pVVar7->pArray;
      }
      pVVar9 = (Vec_Int_t *)(long)pVVar7->nSize;
      pVVar7->nSize = pVVar7->nSize + 1;
      ppvVar8[(long)pVVar9] = p_00;
    }
    iVar2 = clock_gettime(3,&local_a8);
    if (iVar2 < 0) {
      lVar11 = -1;
    }
    else {
      pVVar9 = (Vec_Int_t *)-(local_a8.tv_nsec >> 0x3f);
      lVar11 = local_a8.tv_nsec / 1000 + local_a8.tv_sec * 1000000;
    }
    iVar2 = clock_gettime(3,&local_a8);
    if (iVar2 < 0) {
      lVar10 = 1;
    }
    else {
      lVar13 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_a8.tv_nsec),8);
      pVVar9 = (Vec_Int_t *)-(lVar13 >> 0x3f);
      lVar10 = (long)&pVVar9[local_a8.tv_sec * -0xf424].nCap + (lVar13 >> 7);
    }
    local_40 = Bmc_ChainCleanup(p_01,local_70);
    Gia_ManStop(p_01);
    iVar2 = clock_gettime(3,&local_a8);
    if (iVar2 < 0) {
      lVar13 = -1;
    }
    else {
      pVVar9 = (Vec_Int_t *)-(local_a8.tv_nsec >> 0x3f);
      lVar13 = local_a8.tv_nsec / 1000 + local_a8.tv_sec * 1000000;
    }
    clock_gettime(3,&local_a8);
    clock_gettime(3,&local_a8);
    pGVar6 = local_40;
    if (local_98 != 0) {
      uVar3 = Gia_ManCountNonConst0(local_40);
      printf("Iter %4d : ",(ulong)((int)local_88 + 1));
      printf("Depth =%5d  ",(ulong)local_94);
      printf("FailPo =%5d  ",(ulong)uVar4);
      printf("UndecPo =%5d ",(ulong)uVar3);
      printf("(%6.2f %%)  ",
             ((double)(int)uVar3 * 100.0) / (double)(pGVar6->vCos->nSize - pGVar6->nRegs));
      pVVar9 = pGVar6->vCos;
      printf("AIG =%8d  ",(ulong)(uint)(~(pVVar9->nSize + pGVar6->vCis->nSize) + pGVar6->nObjs));
      iVar14 = 3;
      iVar2 = clock_gettime(3,&local_a8);
      if (iVar2 < 0) {
        lVar12 = -1;
      }
      else {
        pVVar9 = (Vec_Int_t *)-(local_a8.tv_nsec >> 0x3f);
        lVar12 = local_a8.tv_nsec / 1000 + local_a8.tv_sec * 1000000;
      }
      lVar12 = lVar12 - local_90;
      Abc_Print(iVar14,"%s =","Time");
      Abc_Print(iVar14,"%9.2f sec\n",(double)lVar12 / 1000000.0);
    }
    if (local_70->pArray != (int *)0x0) {
      free(local_70->pArray);
    }
    local_60 = local_60 + local_48 + lVar11;
    lVar13 = local_38 + lVar10 + lVar13;
    free(local_70);
    uVar4 = (int)local_88 + 1;
    local_88 = (ulong)uVar4;
    pGVar6 = local_40;
    lVar11 = local_68;
    if (uVar4 == 10000) {
      local_88 = 10000;
LAB_0058a249:
      iVar2 = pGVar6->nRegs;
      iVar14 = pGVar6->vCos->nSize;
      iVar5 = Gia_ManCountNonConst0(pGVar6);
      printf("Completed a CEX chain with %d segments, %d frames, and %d failed POs (out of %d). ",
             local_88,(ulong)local_94,(ulong)(uint)(iVar14 - (iVar5 + iVar2)),
             (ulong)(uint)(pGVar6->vCos->nSize - pGVar6->nRegs));
      ppVVar1 = local_80;
      if (local_98 != 0) {
        iVar14 = 3;
        iVar2 = clock_gettime(3,&local_a8);
        lVar11 = -1;
        lVar10 = -1;
        if (-1 < iVar2) {
          lVar10 = local_a8.tv_nsec / 1000 + local_a8.tv_sec * 1000000;
        }
        lVar10 = lVar10 - local_90;
        Abc_Print(iVar14,"%s =","Time");
        Abc_Print(iVar14,"%9.2f sec\n",(double)lVar10 / 1000000.0);
        iVar14 = 3;
        iVar2 = clock_gettime(3,&local_a8);
        if (-1 < iVar2) {
          lVar11 = local_a8.tv_nsec / 1000 + local_a8.tv_sec * 1000000;
        }
        Abc_Print(iVar14,"%s =","BMC  ");
        dVar15 = 0.0;
        if (lVar11 - local_90 != 0) {
          dVar15 = ((double)local_68 * 100.0) / (double)(lVar11 - local_90);
        }
        Abc_Print(iVar14,"%9.2f sec (%6.2f %%)\n",(double)local_68 / 1000000.0,dVar15);
        iVar14 = 3;
        iVar2 = clock_gettime(3,&local_a8);
        if (iVar2 < 0) {
          lVar11 = -1;
        }
        else {
          lVar11 = local_a8.tv_nsec / 1000 + local_a8.tv_sec * 1000000;
        }
        Abc_Print(iVar14,"%s =","Init ");
        dVar15 = 0.0;
        if (lVar11 - local_90 != 0) {
          dVar15 = ((double)local_58 * 100.0) / (double)(lVar11 - local_90);
        }
        Abc_Print(iVar14,"%9.2f sec (%6.2f %%)\n",(double)local_58 / 1000000.0,dVar15);
        iVar14 = 3;
        iVar2 = clock_gettime(3,&local_a8);
        if (iVar2 < 0) {
          lVar11 = -1;
        }
        else {
          lVar11 = local_a8.tv_nsec / 1000 + local_a8.tv_sec * 1000000;
        }
        Abc_Print(iVar14,"%s =","SAT  ");
        dVar15 = 0.0;
        if (lVar11 - local_90 != 0) {
          dVar15 = ((double)local_60 * 100.0) / (double)(lVar11 - local_90);
        }
        Abc_Print(iVar14,"%9.2f sec (%6.2f %%)\n",(double)local_60 / 1000000.0,dVar15);
        iVar14 = 3;
        iVar2 = clock_gettime(3,&local_a8);
        if (iVar2 < 0) {
          lVar11 = -1;
        }
        else {
          lVar11 = local_a8.tv_nsec / 1000 + local_a8.tv_sec * 1000000;
        }
        Abc_Print(iVar14,"%s =","Clean");
        dVar15 = 0.0;
        if (lVar11 - local_90 != 0) {
          dVar15 = ((double)lVar13 * 100.0) / (double)(lVar11 - local_90);
        }
        Abc_Print(iVar14,"%9.2f sec (%6.2f %%)\n",(double)lVar13 / 1000000.0,dVar15);
      }
      Gia_ManStop(pGVar6);
      if (ppVVar1 != (Vec_Ptr_t **)0x0) {
        printf("Total number of CEXes collected = %d.\n",(ulong)(uint)(*ppVVar1)->nSize);
      }
      return 0;
    }
  }
  if (local_98 != 0) {
    printf("BMC could not detect a failed output in %d frames with %d conflicts.\n",(ulong)local_78,
           (ulong)local_74);
  }
  goto LAB_0058a249;
}

Assistant:

int Bmc_ChainTest( Gia_Man_t * p, int nFrameMax, int nConfMax, int fVerbose, int fVeryVerbose, Vec_Ptr_t ** pvCexes )
{
    int Iter, IterMax = 10000;
    Gia_Man_t * pTemp, * pNew = Gia_ManDup(p);
    Abc_Cex_t * pCex = NULL;
    Vec_Int_t * vOutputs;
    abctime clk2, clk = Abc_Clock(); 
    abctime clkBmc = 0;
    abctime clkMov = 0;
    abctime clkSat = 0;
    abctime clkCln = 0;
    abctime clkSwp = 0;
    int DepthTotal = 0;
    if ( pvCexes )
        *pvCexes = Vec_PtrAlloc( 1000 );
    for ( Iter = 0; Iter < IterMax; Iter++ )
    {
        if ( Gia_ManPoNum(pNew) == 0 )
        {
            if ( fVerbose )
                printf( "Finished all POs.\n" );
            break;
        }
        // run BMC till the first failure
        clk2 = Abc_Clock(); 
        pCex = Bmc_ChainFailOneOutput( pNew, nFrameMax, nConfMax, fVerbose, fVeryVerbose );
        clkBmc += Abc_Clock() - clk2;
        if ( pCex == NULL )
        {
            if ( fVerbose )
                printf( "BMC could not detect a failed output in %d frames with %d conflicts.\n", nFrameMax, nConfMax );
            break;
        }
        assert( !Iter || pCex->iFrame > 0 );
        // move the AIG to the failure state
        clk2 = Abc_Clock(); 
        pNew = Gia_ManVerifyCexAndMove( pTemp = pNew, pCex );
        Gia_ManStop( pTemp );
        DepthTotal += pCex->iFrame;
        clkMov += Abc_Clock() - clk2;
        // find outputs that fail in this state
        clk2 = Abc_Clock(); 
        vOutputs = Bmc_ChainFindFailedOutputs( pNew, pvCexes ? *pvCexes : NULL );
        assert( Vec_IntFind(vOutputs, pCex->iPo) >= 0 );
        // save the counter-example
        if ( pvCexes )
            Vec_PtrPush( *pvCexes, pCex );
        else
            Abc_CexFree( pCex );
        clkSat += Abc_Clock() - clk2;
        // remove them from the AIG 
        clk2 = Abc_Clock(); 
        pNew = Bmc_ChainCleanup( pTemp = pNew, vOutputs );
        Gia_ManStop( pTemp );
        clkCln += Abc_Clock() - clk2;
        // perform sequential cleanup
        clk2 = Abc_Clock(); 
//        pNew = Gia_ManSeqStructSweep( pTemp = pNew, 0, 1, 0 );
//        Gia_ManStop( pTemp );
        clkSwp += Abc_Clock() - clk2;
        // printout
        if ( fVerbose )
        {
            int nNonConst = Gia_ManCountNonConst0(pNew);
            printf( "Iter %4d : ",    Iter+1 );
            printf( "Depth =%5d  ",   DepthTotal );
            printf( "FailPo =%5d  ",  Vec_IntSize(vOutputs) );
            printf( "UndecPo =%5d ",  nNonConst );
            printf( "(%6.2f %%)  ",   100.0 * nNonConst / Gia_ManPoNum(pNew) );
            printf( "AIG =%8d  ",     Gia_ManAndNum(pNew) );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
        }
        Vec_IntFree( vOutputs );
    }
    printf( "Completed a CEX chain with %d segments, %d frames, and %d failed POs (out of %d). ", 
        Iter, DepthTotal, Gia_ManPoNum(pNew) - Gia_ManCountNonConst0(pNew), Gia_ManPoNum(pNew) );
    if ( fVerbose )
    {
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    Abc_PrintTimeP( 1, "BMC  ", clkBmc, Abc_Clock() - clk );
    Abc_PrintTimeP( 1, "Init ", clkMov, Abc_Clock() - clk );
    Abc_PrintTimeP( 1, "SAT  ", clkSat, Abc_Clock() - clk );
    Abc_PrintTimeP( 1, "Clean", clkCln, Abc_Clock() - clk );
//    Abc_PrintTimeP( 1, "Sweep", clkSwp, Abc_Clock() - clk );
    }
    Gia_ManStop( pNew );
    if ( pvCexes )
        printf( "Total number of CEXes collected = %d.\n", Vec_PtrSize(*pvCexes) );
    return 0;
}